

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVarious.hpp
# Opt level: O0

void __thiscall Omega_invoke_Test::TestBody(Omega_invoke_Test *this)

{
  bool bVar1;
  char *message;
  tuple<int,_int,_int,_const_char_*,_int,_int,_double> *tup;
  AssertHelper local_1f0;
  Message local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar;
  undefined1 local_1a0 [8];
  __type t1;
  anon_class_8_1_6971b95b function;
  ostringstream result;
  Omega_invoke_Test *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&function);
  t1.super__Tuple_impl<0UL,_int,_int,_const_char_*>.super__Tuple_impl<1UL,_int,_const_char_*>._8_8_
       = (ostringstream *)&function;
  omega::make_list<1,3,std::tuple<int,int,int,char_const*,int,int,double>const&>
            ((__type *)local_1a0,(omega *)&::t,tup);
  omega::invoke<Omega_invoke_Test::TestBody()::__0&,std::tuple<int,int,char_const*>const&>
            ((anon_class_8_1_6971b95b *)
             &t1.super__Tuple_impl<0UL,_int,_int,_const_char_*>.
              super__Tuple_impl<1UL,_int,_const_char_*>.super__Head_base<1UL,_int,_false>,
             (tuple<int,_int,_const_char_*> *)local_1a0);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[19]>
            ((EqHelper<false> *)local_1c0,"result.str()","\"a=6, b=7, n=yuppi!\"",&local_1e0,
             (char (*) [19])"a=6, b=7, n=yuppi!");
  std::__cxx11::string::~string((string *)&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/meox[P]omega/Test/TestVarious.hpp"
               ,0x1d,message);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&function);
  return;
}

Assistant:

TEST(Omega, invoke)
{
    std::ostringstream result;
    auto function = [&result](int a, int b, std::string const &n)
    {
        result << "a=" << a << ", b=" << b << ", n=" << n;
    };

    auto const t1 = omega::make_list<1, 3>(t);

    omega::invoke(function, t1);
    EXPECT_EQ(result.str(), "a=6, b=7, n=yuppi!");

}